

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

char * comm_bit_name(long *comm_flags)

{
  char *pcVar1;
  size_t sVar2;
  
  comm_bit_name::buf[0] = '\0';
  if ((*comm_flags & 1) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," qui",4);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 3,"iet",4);
  }
  if ((*comm_flags & 2) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," dea",4);
    (comm_bit_name::buf + sVar2 + 4)[0] = 'f';
    (comm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*comm_flags & 4) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_wiz",8);
  }
  if ((*comm_flags & 8) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_auct",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 8,"ion",4);
  }
  if ((*comm_flags & 0x10) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_goss",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 7,"sip",4);
  }
  if ((*comm_flags & 0x20) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_ques",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 5,"uestion",8);
  }
  if ((*comm_flags & 0x40) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_newb",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 7,"bie",4);
  }
  if ((*comm_flags & 0x100) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_quot",8);
    (comm_bit_name::buf + sVar2 + 8)[0] = 'e';
    (comm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*comm_flags & 0x800) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," compact",8);
    comm_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*comm_flags & 0x1000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," bri",4);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 3,"ief",4);
  }
  if ((*comm_flags & 0x2000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," prompt",8);
  }
  if ((*comm_flags & 0x4000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," combine",8);
    comm_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*comm_flags & 0x80000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_emot",8);
    (comm_bit_name::buf + sVar2 + 8)[0] = 'e';
    (comm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*comm_flags & 0x100000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_shou",8);
    (comm_bit_name::buf + sVar2 + 8)[0] = 't';
    (comm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*comm_flags & 0x200000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_tell",8);
    comm_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*comm_flags & 0x400000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," no_chan",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 5,"hannels",8);
  }
  if ((*comm_flags & 0x400) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," col",4);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 3,"lor",4);
  }
  if ((*comm_flags & 0x10000000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," switchs",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 6,"hskills",8);
  }
  if ((*comm_flags & 0x40000000) != 0) {
    sVar2 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar2," lots o ",8);
    builtin_strncpy(comm_bit_name::buf + sVar2 + 7," color!",8);
  }
  pcVar1 = comm_bit_name::buf;
  if (comm_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *comm_bit_name(long comm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(comm_flags, COMM_QUIET))
		strcat(buf, " quiet");

	if (IS_SET(comm_flags, COMM_DEAF))
		strcat(buf, " deaf");

	if (IS_SET(comm_flags, COMM_NOWIZ))
		strcat(buf, " no_wiz");

	if (IS_SET(comm_flags, COMM_NOAUCTION))
		strcat(buf, " no_auction");

	if (IS_SET(comm_flags, COMM_NOGOSSIP))
		strcat(buf, " no_gossip");

	if (IS_SET(comm_flags, COMM_NOQUESTION))
		strcat(buf, " no_question");

	if (IS_SET(comm_flags, COMM_NONEWBIE))
		strcat(buf, " no_newbie");

	if (IS_SET(comm_flags, COMM_NOQUOTE))
		strcat(buf, " no_quote");

	if (IS_SET(comm_flags, COMM_COMPACT))
		strcat(buf, " compact");

	if (IS_SET(comm_flags, COMM_BRIEF))
		strcat(buf, " brief");

	if (IS_SET(comm_flags, COMM_PROMPT))
		strcat(buf, " prompt");

	if (IS_SET(comm_flags, COMM_COMBINE))
		strcat(buf, " combine");

	if (IS_SET(comm_flags, COMM_NOEMOTE))
		strcat(buf, " no_emote");

	if (IS_SET(comm_flags, COMM_NOSHOUT))
		strcat(buf, " no_shout");

	if (IS_SET(comm_flags, COMM_NOTELL))
		strcat(buf, " no_tell");

	if (IS_SET(comm_flags, COMM_NOCHANNELS))
		strcat(buf, " no_channels");

	if (IS_SET(comm_flags, COMM_ANSI))
		strcat(buf, " color");

	if (IS_SET(comm_flags, COMM_SWITCHSKILLS))
		strcat(buf, " switchskills");

	if (IS_SET(comm_flags, COMM_LOTS_O_COLOR))
		strcat(buf, " lots o color!");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}